

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_loop.cpp
# Opt level: O0

void __thiscall
pseudo_loop::compute_VP(pseudo_loop *this,cand_pos_t i,cand_pos_t j,sparse_tree *tree)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  energy_t eVar1;
  energy_t eVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  uint *puVar6;
  int *piVar7;
  vector<Node,_std::allocator<Node>_> *in_RCX;
  int in_EDX;
  int in_ESI;
  sparse_tree *in_RDI;
  energy_t min;
  energy_t vp_split;
  energy_t vp_iloop;
  energy_t vp_h;
  cand_pos_t k_4;
  cand_pos_t k_3;
  cand_pos_t k_2;
  cand_pos_t k_1;
  cand_pos_t max_i_bp;
  cand_pos_t min_Bp_j;
  energy_t tmp;
  pair_type ptype_closingkj;
  cand_pos_t l;
  cand_pos_t edge_j;
  cand_pos_t max_borders;
  cand_pos_t k;
  cand_pos_t edge_i;
  cand_pos_t min_borders;
  pair_type ptype_closingip1jm1;
  energy_t WI_bp_plus_j_minus_1;
  energy_t WI_B_plus_b_minus;
  energy_t WI_i_plus_Bp_minus;
  energy_t WI_bp_plus_j_minus;
  energy_t WI_i_plus_b_minus;
  energy_t WI_Bplus_jminus;
  energy_t WI_ipus1_BPminus;
  cand_pos_t bp_ij;
  cand_pos_t b_ij;
  cand_pos_t B_ij;
  cand_pos_t Bp_ij;
  energy_t m9;
  energy_t m8;
  energy_t m7;
  energy_t m6;
  energy_t m5;
  energy_t m4;
  energy_t m3;
  energy_t m2;
  energy_t m1;
  pair_type ptype_closing;
  cand_pos_t ij;
  undefined8 in_stack_fffffffffffffe28;
  cand_pos_t in_stack_fffffffffffffe30;
  cand_pos_t in_stack_fffffffffffffe34;
  energy_t in_stack_fffffffffffffe38;
  energy_t in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int local_19c;
  int local_198;
  int local_194;
  int *local_190;
  undefined8 local_188;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int *local_168;
  undefined8 local_160;
  int local_154;
  int local_150;
  int local_14c;
  int *local_148;
  undefined8 local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int *local_128;
  undefined8 local_120;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  int local_dc;
  short local_d6;
  int local_d4;
  int local_d0;
  int local_cc;
  int *local_c8;
  undefined8 local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  uint local_a8;
  int local_a4;
  uint *local_a0;
  undefined8 local_98;
  int local_8c;
  int local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  short local_72;
  energy_t local_70;
  int local_6c;
  energy_t local_68;
  energy_t local_64;
  int local_60;
  energy_t local_5c;
  int local_58;
  int local_54;
  uint local_50;
  int local_4c;
  uint local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined2 local_1e;
  int local_1c;
  vector<Node,_std::allocator<Node>_> *local_18;
  int local_10;
  int local_c;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &in_RDI[1].level.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long)in_ESI);
  local_1c = (*pvVar4 + local_10) - local_c;
  local_1e = (undefined2)
             pair[*(short *)((long)in_RDI[1].euler.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + (long)local_c * 2)]
             [*(short *)((long)in_RDI[1].euler.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish + (long)local_10 * 2)];
  local_24 = 10000000;
  local_28 = 10000000;
  local_2c = 10000000;
  local_30 = 10000000;
  local_34 = 10000000;
  local_38 = 10000000;
  local_3c = 10000000;
  local_40 = 10000000;
  local_44 = 10000000;
  local_48 = sparse_tree::Bp((sparse_tree *)
                             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                             in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
  local_4c = sparse_tree::B(in_RDI,in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
  local_50 = sparse_tree::b(in_RDI,in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
  local_54 = sparse_tree::bp((sparse_tree *)
                             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                             in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
  pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[](local_18,(long)local_c);
  if (0 < pvVar5->parent->index) {
    pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[](local_18,(long)local_10);
    in_stack_fffffffffffffe54 = pvVar5->parent->index;
    pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[](local_18,(long)local_c);
    if ((((in_stack_fffffffffffffe54 < pvVar5->parent->index) && (-1 < (int)local_48)) &&
        (-1 < local_4c)) && (local_54 < 0)) {
      local_58 = get_WI((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                        ,in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
      local_5c = get_WI((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                        ,in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
      local_24 = local_58 + local_5c;
    }
  }
  pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[](local_18,(long)local_c);
  iVar3 = pvVar5->parent->index;
  pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[](local_18,(long)local_10);
  if (((iVar3 < pvVar5->parent->index) &&
      (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[](local_18,(long)local_10),
      0 < pvVar5->parent->index)) &&
     ((-1 < (int)local_50 && ((-1 < local_54 && ((int)local_48 < 0)))))) {
    local_60 = get_WI((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    local_64 = get_WI((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    local_28 = local_60 + local_64;
  }
  pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[](local_18,(long)local_c);
  if (((((0 < pvVar5->parent->index) &&
        (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[](local_18,(long)local_10),
        0 < pvVar5->parent->index)) && (-1 < (int)local_48)) &&
      ((-1 < local_4c && (-1 < (int)local_50)))) && (-1 < local_54)) {
    local_68 = get_WI((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    local_6c = get_WI((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    local_70 = get_WI((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    local_2c = local_68 + local_6c + local_70;
  }
  local_72 = (short)pair[*(short *)((long)in_RDI[1].euler.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish +
                                   (long)(local_c + 1) * 2)]
                    [*(short *)((long)in_RDI[1].euler.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish +
                               (long)(local_10 + -1) * 2)];
  pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[](local_18,(long)(local_c + 1));
  if (((pvVar5->pair < -1) &&
      (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[](local_18,(long)(local_10 + -1))
      , pvVar5->pair < -1)) && (0 < local_72)) {
    eVar1 = get_e_stP((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    eVar2 = get_VP((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    local_30 = eVar1 + eVar2;
  }
  local_7c = local_48;
  local_80 = local_50;
  puVar6 = std::min<unsigned_int>(&local_7c,&local_80);
  local_78 = *puVar6;
  local_88 = local_c + 0x1f;
  local_8c = local_10 + -4;
  piVar7 = std::min<int>(&local_88,&local_8c);
  local_a4 = *piVar7;
  local_a8 = local_78;
  local_a0 = &local_a8;
  local_98 = 2;
  __l._M_len._0_4_ = in_stack_fffffffffffffe30;
  __l._M_array = (iterator)in_stack_fffffffffffffe28;
  __l._M_len._4_4_ = in_stack_fffffffffffffe34;
  local_84 = local_a4;
  local_78 = std::min<int>(__l);
  local_ac = local_c;
  while (local_ac = local_ac + 1, local_ac < (int)local_78) {
    pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[](local_18,(long)local_ac);
    if ((pvVar5->pair < -1) &&
       (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 6),
                            (long)(local_ac + -1)), (local_ac - local_c) + -1 <= *pvVar4)) {
      piVar7 = std::max<int>(&local_54,&local_4c);
      local_d0 = *piVar7 + 1;
      local_cc = ((local_ac + local_10) - local_c) + -0x20;
      local_c8 = &local_d0;
      local_c0 = 2;
      __l_00._M_len._0_4_ = in_stack_fffffffffffffe30;
      __l_00._M_array = (iterator)in_stack_fffffffffffffe28;
      __l_00._M_len._4_4_ = in_stack_fffffffffffffe34;
      local_b4 = local_cc;
      local_b0 = local_d0;
      local_b0 = std::max<int>(__l_00);
      local_d4 = local_10;
      while (local_d4 = local_d4 + -1, local_b0 < local_d4) {
        local_d6 = (short)pair[*(short *)((long)in_RDI[1].euler.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish +
                                         (long)local_ac * 2)]
                          [*(short *)((long)in_RDI[1].euler.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish + (long)local_d4 * 2)]
        ;
        pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[](local_18,(long)local_d4);
        if (((pvVar5->pair < -1) && (0 < local_d6)) &&
           (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_18 + 6),
                                (long)(local_10 + -1)), (local_10 - local_d4) + -1 <= *pvVar4)) {
          eVar1 = get_e_intP((pseudo_loop *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                             in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
                             in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
          eVar2 = get_VP((pseudo_loop *)
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                         in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
          local_dc = eVar1 + eVar2;
          piVar7 = std::min<int>(&local_34,&local_dc);
          local_34 = *piVar7;
        }
      }
    }
  }
  local_e4 = sparse_tree::b(in_RDI,in_stack_fffffffffffffe54,iVar3);
  local_e8 = sparse_tree::Bp((sparse_tree *)
                             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                             in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
  puVar6 = std::min<unsigned_int>(&local_e4,&local_e8);
  local_e0 = *puVar6;
  local_f0 = sparse_tree::B(in_RDI,in_stack_fffffffffffffe54,iVar3);
  local_f4 = sparse_tree::bp((sparse_tree *)
                             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                             in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
  piVar7 = std::max<int>(&local_f0,&local_f4);
  local_ec = *piVar7;
  local_f8 = local_c;
  while (local_f8 = local_f8 + 1, local_f8 < (int)local_e0) {
    eVar1 = get_WIP((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                    in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    eVar2 = get_VP((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    local_38 = eVar1 + eVar2;
  }
  local_38 = ap_penalty + bp_penalty * 2 + local_38;
  local_fc = local_ec;
  while (local_fc = local_fc + 1, local_fc < local_10) {
    eVar1 = get_VP((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    eVar2 = get_WIP((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                    in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    local_100 = eVar1 + eVar2;
    piVar7 = std::min<int>(&local_3c,&local_100);
    local_3c = *piVar7;
  }
  local_3c = ap_penalty + bp_penalty * 2 + local_3c;
  while (local_104 = local_c + 1, local_104 < (int)local_e0) {
    in_stack_fffffffffffffe3c =
         get_WIP((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    eVar1 = get_VPR((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                    in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    local_108 = in_stack_fffffffffffffe3c + eVar1;
    piVar7 = std::min<int>(&local_40,&local_108);
    local_40 = *piVar7;
    local_c = local_104;
  }
  local_40 = ap_penalty + bp_penalty * 2 + local_40;
  local_10c = local_ec;
  while (local_10c = local_10c + 1, local_10c < local_10) {
    in_stack_fffffffffffffe38 =
         get_VPL((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    eVar1 = get_WIP((pseudo_loop *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                    in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    local_110 = in_stack_fffffffffffffe38 + eVar1;
    piVar7 = std::min<int>(&local_44,&local_110);
    local_44 = *piVar7;
  }
  local_44 = ap_penalty + bp_penalty * 2 + local_44;
  local_134 = local_24;
  local_130 = local_28;
  local_12c = local_2c;
  local_128 = &local_134;
  local_120 = 3;
  __l_01._M_len._0_4_ = in_stack_fffffffffffffe30;
  __l_01._M_array = (iterator)in_stack_fffffffffffffe28;
  __l_01._M_len._4_4_ = in_stack_fffffffffffffe34;
  local_114 = std::min<int>(__l_01);
  local_150 = local_30;
  local_14c = local_34;
  local_148 = &local_150;
  local_140 = 2;
  __l_02._M_len._0_4_ = in_stack_fffffffffffffe30;
  __l_02._M_array = (iterator)in_stack_fffffffffffffe28;
  __l_02._M_len._4_4_ = in_stack_fffffffffffffe34;
  local_138 = std::min<int>(__l_02);
  local_178 = local_38;
  local_174 = local_3c;
  local_170 = local_40;
  local_16c = local_44;
  local_168 = &local_178;
  local_160 = 4;
  __l_03._M_len._0_4_ = in_stack_fffffffffffffe30;
  __l_03._M_array = (iterator)in_stack_fffffffffffffe28;
  __l_03._M_len._4_4_ = in_stack_fffffffffffffe34;
  local_194 = std::min<int>(__l_03);
  local_19c = local_114;
  local_198 = local_138;
  local_190 = &local_19c;
  local_188 = 3;
  __l_04._M_len._0_4_ = in_stack_fffffffffffffe30;
  __l_04._M_array = (iterator)in_stack_fffffffffffffe28;
  __l_04._M_len._4_4_ = in_stack_fffffffffffffe34;
  local_154 = local_194;
  iVar3 = std::min<int>(__l_04);
  local_17c = iVar3;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&(in_RDI->structure)._M_string_length,
                      (long)local_1c);
  *pvVar4 = iVar3;
  return;
}

Assistant:

void pseudo_loop::compute_VP(cand_pos_t i, cand_pos_t j, sparse_tree &tree){
	cand_pos_t ij = index[i]+j-i;

	const pair_type ptype_closing = pair[S_[i]][S_[j]];	
	
	energy_t m1 = INF, m2 = INF, m3 = INF, m4= INF, m5 = INF, m6 = INF, m7 = INF, m8 = INF, m9 = INF; //different branches
	
	// Borders -- added one to i and j to make it fit current bounds but also subtracted 1 from answer as the tree bounds are shifted as well
	cand_pos_t Bp_ij = tree.Bp(i,j);
	cand_pos_t B_ij = tree.B(i,j);
	cand_pos_t b_ij = tree.b(i,j);
	cand_pos_t bp_ij = tree.bp(i,j);
	
	//branchs:
	// 1) inArc(i) and NOT_inArc(j)
	// WI(i+1)(B'(i,j)-1)+WI(B(i,j)+1)(j-1)

	// Hosna April 9th, 2007
	// need to check the borders as they may be negative
	if((tree.tree[i].parent->index) > 0 && (tree.tree[j].parent->index) < (tree.tree[i].parent->index) && Bp_ij >= 0 && B_ij >= 0 && bp_ij < 0){
		energy_t WI_ipus1_BPminus = get_WI(i+1,Bp_ij - 1) ;
		energy_t WI_Bplus_jminus = get_WI(B_ij + 1,j-1);
		m1 =   WI_ipus1_BPminus + WI_Bplus_jminus;
	}

	// 2) NOT_inArc(i) and inArc(j)
	// WI(i+1)(b(i,j)-1)+WI(b'(i,j)+1)(j-1)

	// Hosna April 9th, 2007
	// checking the borders as they may be negative
	if ((tree.tree[i].parent->index) < (tree.tree[j].parent->index) && (tree.tree[j].parent->index) > 0 && b_ij>= 0 && bp_ij >= 0 && Bp_ij < 0){
		energy_t WI_i_plus_b_minus = get_WI(i+1,b_ij - 1);
		energy_t WI_bp_plus_j_minus = get_WI(bp_ij + 1,j-1);
		m2 = WI_i_plus_b_minus + WI_bp_plus_j_minus;
	}

	// 3) inArc(i) and inArc(j)
	// WI(i+1)(B'(i,j)-1)+WI(B(i,j)+1)(b(i,j)-1)+WI(b'(i,j)+1)(j-1)

	// Hosna April 9th, 2007
	// checking the borders as they may be negative
	if((tree.tree[i].parent->index) > 0 && (tree.tree[j].parent->index) > 0 && Bp_ij >= 0 && B_ij >= 0  && b_ij >= 0 && bp_ij>= 0){
		energy_t WI_i_plus_Bp_minus = get_WI(i+1,Bp_ij - 1);
		energy_t WI_B_plus_b_minus = get_WI(B_ij + 1,b_ij - 1);
		energy_t WI_bp_plus_j_minus = get_WI(bp_ij +1,j - 1);
		m3 = WI_i_plus_Bp_minus + WI_B_plus_b_minus + WI_bp_plus_j_minus;
	}

	// 4) NOT_paired(i+1) and NOT_paired(j-1) and they can pair together
	// e_stP(i,i+1,j-1,j) + VP(i+1)(j-1)
	pair_type ptype_closingip1jm1 = pair[S_[i+1]][S_[j-1]];
	if((tree.tree[i+1].pair) < -1 && (tree.tree[j-1].pair) < -1 && ptype_closingip1jm1>0){
		m4 = get_e_stP(i,j)+ get_VP(i+1,j-1);
	}

	// 5) NOT_paired(r) and NOT_paired(rp)
	//  VP(i,j) = e_intP(i,ip,jp,j) + VP(ip,jp)
	// Hosna, April 6th, 2007
	// whenever we use get_borders we have to check for the correct values
	cand_pos_t min_borders = std::min((cand_pos_tu) Bp_ij, (cand_pos_tu) b_ij);
	cand_pos_t edge_i = std::min(i+MAXLOOP+1,j-TURN-1);
	min_borders = std::min({min_borders,edge_i});
//		printf("B'(%d,%d) = %d, b(%d,%d) = %d, min_borders = %d\n",i,j,get_Bp(i,j),i,j,get_b(i,j), min_borders);
	for (cand_pos_t k = i+1; k < min_borders; ++k){
		// Hosna: April 20, 2007
		// i and ip and j and jp should be in the same arc
		// also it should be the case that [i+1,ip-1] && [jp+1,j-1] are empty regions

		if (tree.tree[k].pair < -1 && (tree.up[(k)-1] >= ((k)-(i)-1))){
			// Hosna, April 6th, 2007
			// whenever we use get_borders we have to check for the correct values
			cand_pos_t max_borders = std::max(bp_ij,B_ij)+1;
			cand_pos_t edge_j = k+j-i-MAXLOOP-2;
			max_borders = std::max({max_borders,edge_j});
			for (cand_pos_t l = j-1; l > max_borders ; --l){

				pair_type ptype_closingkj = pair[S_[k]][S_[l]];
				if (tree.tree[l].pair < -1 && ptype_closingkj>0 && (tree.up[(j)-1] >= ((j)-(l)-1))){
					// Hosna: April 20, 2007
					// i and ip and j and jp should be in the same arc -- If it's unpaired between them, they have to be
					energy_t tmp = get_e_intP(i,k,l,j) + get_VP(k,l);
					m5 = std::min(m5,tmp);
					
				}
			}
		}
	}

		cand_pos_t min_Bp_j = std::min((cand_pos_tu) tree.b(i,j), (cand_pos_tu) tree.Bp(i,j));
		cand_pos_t max_i_bp = std::max(tree.B(i,j),tree.bp(i,j));

		for(cand_pos_t k = i+1; k<min_Bp_j; ++k){
			m6 = get_WIP(i+1,k-1) + get_VP(k,j-1);
		}
		
		m6 += ap_penalty + 2*bp_penalty;

		for(cand_pos_t k = max_i_bp+1; k<j; ++k){
			m7 = std::min(m7,get_VP(i+1,k) + get_WIP(k+1,j-1));
		}

		m7 += ap_penalty + 2*bp_penalty;

		for(cand_pos_t k = i+1; k<min_Bp_j; ++k){
			m8 =  std::min(m8,get_WIP(i+1,k-1) + get_VPR(k,j-1));
		}

		m8 += ap_penalty + 2*bp_penalty;

		for(cand_pos_t k = max_i_bp+1; k<j; ++k){
			m9 = std::min(m9,get_VPL(i+1,k) + get_WIP(k+1,j-1));
		}

		m9 += ap_penalty + 2*bp_penalty;

		



	//finding the min energy
	energy_t vp_h = std::min({m1,m2,m3});
	energy_t vp_iloop = std::min({m4,m5});
	energy_t vp_split = std::min({m6,m7,m8,m9});
	energy_t min = std::min({vp_h,vp_iloop,vp_split});

	VP[ij] = min;
	
}